

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<float> * __thiscall
cimg_library::CImg<float>::draw_image
          (CImg<float> *this,int x0,int y0,int z0,int c0,CImg<float> *sprite,float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int y;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined7 extraout_var;
  CImg<float> *pCVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float *__dest;
  float *__src;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar22 [16];
  CImg<float> local_50;
  
  bVar5 = is_empty(this);
  if ((!bVar5) && (sprite->_data != (float *)0x0)) {
    bVar5 = is_overlapped<float>(this,sprite);
    if (bVar5) {
      operator+(&local_50,sprite);
      this = draw_image(this,x0,y0,z0,c0,&local_50,opacity);
      ~CImg(&local_50);
    }
    else {
      uVar6 = y0 | x0 | z0 | c0;
      if (uVar6 == 0) {
        bVar5 = is_sameXYZC<float>(this,sprite);
        uVar6 = (uint)CONCAT71(extraout_var,bVar5);
        if (((1.0 <= opacity) && (bVar5)) && (this->_is_shared == false)) {
          pCVar9 = assign<float>(this,sprite,false);
          return pCVar9;
        }
      }
      uVar20 = -(uint)(x0 < 0) & x0;
      iVar21 = x0 + sprite->_width;
      iVar23 = y0 + sprite->_height;
      iVar24 = z0 + sprite->_depth;
      iVar25 = c0 + sprite->_spectrum;
      iVar19 = sprite->_width + uVar20 +
               (this->_width - iVar21 & -(uint)((int)this->_width < iVar21));
      iVar23 = sprite->_height + (-(uint)(y0 < 0) & y0) +
               (this->_height - iVar23 & -(uint)((int)this->_height < iVar23));
      iVar24 = sprite->_depth + (-(uint)(z0 < 0) & z0) +
               (this->_depth - iVar24 & -(uint)((int)this->_depth < iVar24));
      iVar25 = sprite->_spectrum + (-(uint)(c0 < 0) & c0) +
               (this->_spectrum - iVar25 & -(uint)((int)this->_spectrum < iVar25));
      auVar22._0_4_ = -(uint)(0 < iVar19);
      auVar22._4_4_ = -(uint)(0 < iVar23);
      auVar22._8_4_ = -(uint)(0 < iVar24);
      auVar22._12_4_ = -(uint)(0 < iVar25);
      iVar21 = movmskps(uVar6,auVar22);
      if (iVar21 == 0xf) {
        uVar6 = sprite->_width;
        uVar14 = (ulong)uVar6;
        uVar1 = sprite->_height;
        uVar15 = (ulong)this->_width;
        uVar2 = this->_height;
        uVar3 = sprite->_depth;
        lVar13 = uVar2 * uVar15;
        uVar4 = this->_depth;
        __src = sprite->_data +
                (((-(long)(int)(z0 >> 0x1f & uVar1 * uVar6 * z0) -
                  (long)(int)(c0 >> 0x1f & uVar3 * c0 * uVar1 * uVar6)) -
                 (long)(int)(y0 >> 0x1f & uVar6 * y0)) - (long)(int)uVar20);
        uVar16 = 0;
        uVar18 = (ulong)(uint)x0;
        if (x0 < 1) {
          uVar18 = uVar16;
        }
        uVar17 = (ulong)(uint)y0;
        if (y0 < 1) {
          uVar17 = uVar16;
        }
        uVar8 = (ulong)(uint)z0;
        if (z0 < 1) {
          uVar8 = uVar16;
        }
        uVar12 = (ulong)(uint)c0;
        if (c0 < 1) {
          uVar12 = uVar16;
        }
        __dest = this->_data + uVar18 + uVar17 * uVar15 + uVar8 * lVar13 + uVar4 * uVar12 * lVar13;
        for (; (int)uVar16 != iVar25; uVar16 = (ulong)((int)uVar16 + 1)) {
          for (iVar21 = 0; iVar21 != iVar24; iVar21 = iVar21 + 1) {
            iVar7 = iVar23;
            if (1.0 <= opacity) {
              while (bVar5 = iVar7 != 0, iVar7 = iVar7 + -1, bVar5) {
                memcpy(__dest,__src,(long)iVar19 * 4);
                __dest = __dest + this->_width;
                __src = __src + sprite->_width;
              }
            }
            else {
              for (iVar7 = 0; iVar7 != iVar23; iVar7 = iVar7 + 1) {
                sVar10 = (long)iVar19 * 4;
                for (lVar11 = 0; iVar19 != (int)lVar11; lVar11 = lVar11 + 1) {
                  __dest[lVar11] =
                       __src[lVar11] * ABS(opacity) +
                       __dest[lVar11] * (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity));
                  sVar10 = sVar10 - 4;
                }
                __dest = (float *)((long)__dest + (uVar15 * 4 - sVar10));
                __src = (float *)((long)__src + (uVar14 * 4 - sVar10));
              }
            }
            __dest = __dest + (uVar2 - iVar23) * uVar15;
            __src = __src + (uVar1 - iVar23) * uVar14;
          }
          __dest = __dest + (ulong)(uVar4 - iVar24) * lVar13;
          __src = __src + (ulong)(uVar3 - iVar24) * uVar1 * uVar14;
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared()) return assign(sprite,false);
      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const T
        *ptrs = sprite._data -
        (bx?x0:0) -
        (by?y0*sprite.width():0) -
        (bz?z0*sprite.width()*sprite.height():0) -
        (bc?c0*sprite.width()*sprite.height()*sprite.depth():0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ),
        slX = lX*sizeof(T);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
        T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            if (opacity>=1) for (int y = 0; y<lY; ++y) { std::memcpy(ptrd,ptrs,slX); ptrd+=_width; ptrs+=sprite._width; }
            else for (int y = 0; y<lY; ++y) {
                for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
                ptrd+=offX; ptrs+=soffX;
              }
            ptrd+=offY; ptrs+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ;
        }
      }
      return *this;
    }